

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

ptrlen BinarySource_get_chomped_line(BinarySource *src)

{
  void *__s;
  void *pvVar1;
  void *local_30;
  char *end;
  char *start;
  BinarySource *src_local;
  
  if (src->err == BSE_NO_ERROR) {
    __s = (void *)((long)src->data + src->pos);
    pvVar1 = memchr(__s,10,src->len - src->pos);
    if (pvVar1 == (void *)0x0) {
      src->pos = (src->len - src->pos) + src->pos;
    }
    else {
      src->pos = (long)pvVar1 + src->pos + (1 - (long)__s);
    }
    local_30 = (void *)((long)src->data + src->pos);
    if ((__s < local_30) && (*(char *)((long)local_30 + -1) == '\n')) {
      local_30 = (void *)((long)local_30 + -1);
    }
    if ((__s < local_30) && (*(char *)((long)local_30 + -1) == '\r')) {
      local_30 = (void *)((long)local_30 + -1);
    }
    _src_local = make_ptrlen(__s,(long)local_30 - (long)__s);
  }
  else {
    _src_local = make_ptrlen((void *)((long)src->data + src->pos),0);
  }
  return _src_local;
}

Assistant:

ptrlen BinarySource_get_chomped_line(BinarySource *src)
{
    const char *start, *end;

    if (src->err)
        return make_ptrlen(here, 0);

    start = here;
    end = memchr(start, '\n', src->len - src->pos);
    if (end)
        advance(end + 1 - start);
    else
        advance(src->len - src->pos);
    end = here;

    if (end > start && end[-1] == '\n')
        end--;
    if (end > start && end[-1] == '\r')
        end--;

    return make_ptrlen(start, end - start);
}